

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgttb(fitsfile *fptr,LONGLONG *rowlen,LONGLONG *nrows,LONGLONG *pcount,long *tfields,
          int *status)

{
  int iVar1;
  int *status_local;
  long *tfields_local;
  LONGLONG *pcount_local;
  LONGLONG *nrows_local;
  LONGLONG *rowlen_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar1 = fftkyn(fptr,2,"BITPIX","8",status);
    if (iVar1 == 0xd0) {
      *status = 0xde;
      fptr_local._4_4_ = 0xde;
    }
    else if (*status == 0xd1) {
      *status = 0xd3;
      fptr_local._4_4_ = 0xd3;
    }
    else {
      iVar1 = fftkyn(fptr,3,"NAXIS","2",status);
      if (iVar1 == 0xd0) {
        *status = 0xdf;
        fptr_local._4_4_ = 0xdf;
      }
      else if (*status == 0xd1) {
        *status = 0xd4;
        fptr_local._4_4_ = 0xd4;
      }
      else {
        iVar1 = ffgtknjj(fptr,4,"NAXIS1",rowlen,status);
        if (iVar1 == 0xd0) {
          *status = 0xe0;
          fptr_local._4_4_ = 0xe0;
        }
        else if (*status == 0xd1) {
          fptr_local._4_4_ = (uint)(*status == 0xd5);
        }
        else {
          iVar1 = ffgtknjj(fptr,5,"NAXIS2",nrows,status);
          if (iVar1 == 0xd0) {
            *status = 0xe0;
            fptr_local._4_4_ = 0xe0;
          }
          else if (*status == 0xd1) {
            fptr_local._4_4_ = (uint)(*status == 0xd5);
          }
          else {
            iVar1 = ffgtknjj(fptr,6,"PCOUNT",pcount,status);
            if (iVar1 == 0xd0) {
              *status = 0xe4;
              fptr_local._4_4_ = 0xe4;
            }
            else if (*status == 0xd1) {
              *status = 0xd6;
              fptr_local._4_4_ = 0xd6;
            }
            else {
              iVar1 = fftkyn(fptr,7,"GCOUNT","1",status);
              if (iVar1 == 0xd0) {
                *status = 0xe5;
                fptr_local._4_4_ = 0xe5;
              }
              else if (*status == 0xd1) {
                *status = 0xd7;
                fptr_local._4_4_ = 0xd7;
              }
              else {
                iVar1 = ffgtkn(fptr,8,"TFIELDS",tfields,status);
                if (iVar1 == 0xd0) {
                  *status = 0xe6;
                  fptr_local._4_4_ = 0xe6;
                }
                else if ((*status == 0xd1) || (999 < *tfields)) {
                  fptr_local._4_4_ = (uint)(*status == 0xd8);
                }
                else {
                  if (0 < *status) {
                    ffpmsg("Error reading required keywords in the table header (FTGTTB).");
                  }
                  fptr_local._4_4_ = *status;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgttb(fitsfile *fptr,      /* I - FITS file pointer*/
           LONGLONG *rowlen,        /* O - length of a table row, in bytes */
           LONGLONG *nrows,         /* O - number of rows in the table */
           LONGLONG *pcount,    /* O - value of PCOUNT keyword */
           long *tfields,       /* O - number of fields in the table */
           int *status)         /* IO - error status    */
{
/*
  Get and Test TaBle;
  Test that this is a legal ASCII or binary table and get some keyword values.
  We assume that the calling routine has already tested the 1st keyword
  of the extension to ensure that this is really a table extension.
*/
    if (*status > 0)
        return(*status);

    if (fftkyn(fptr, 2, "BITPIX", "8", status) == BAD_ORDER) /* 2nd keyword */
        return(*status = NO_BITPIX);  /* keyword not BITPIX */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_BITPIX); /* value != 8 */

    if (fftkyn(fptr, 3, "NAXIS", "2", status) == BAD_ORDER) /* 3rd keyword */
        return(*status = NO_NAXIS);  /* keyword not NAXIS */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_NAXIS); /* value != 2 */

    if (ffgtknjj(fptr, 4, "NAXIS1", rowlen, status) == BAD_ORDER) /* 4th key */
        return(*status = NO_NAXES);  /* keyword not NAXIS1 */
    else if (*status == NOT_POS_INT)
        return(*status == BAD_NAXES); /* bad NAXIS1 value */

    if (ffgtknjj(fptr, 5, "NAXIS2", nrows, status) == BAD_ORDER) /* 5th key */
        return(*status = NO_NAXES);  /* keyword not NAXIS2 */
    else if (*status == NOT_POS_INT)
        return(*status == BAD_NAXES); /* bad NAXIS2 value */

    if (ffgtknjj(fptr, 6, "PCOUNT", pcount, status) == BAD_ORDER) /* 6th key */
        return(*status = NO_PCOUNT);  /* keyword not PCOUNT */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_PCOUNT); /* bad PCOUNT value */

    if (fftkyn(fptr, 7, "GCOUNT", "1", status) == BAD_ORDER) /* 7th keyword */
        return(*status = NO_GCOUNT);  /* keyword not GCOUNT */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_GCOUNT); /* value != 1 */

    if (ffgtkn(fptr, 8, "TFIELDS", tfields, status) == BAD_ORDER) /* 8th key*/
        return(*status = NO_TFIELDS);  /* keyword not TFIELDS */
    else if (*status == NOT_POS_INT || *tfields > 999)
        return(*status == BAD_TFIELDS); /* bad TFIELDS value */


    if (*status > 0)
       ffpmsg(
       "Error reading required keywords in the table header (FTGTTB).");

    return(*status);
}